

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O0

void help(void)

{
  fprintf(_stderr,
          "-h help\n-i use index file (no zip input)\n-z zip input\n-s skipheader\n-v version\n");
  return;
}

Assistant:

void help()
{
	fprintf(stderr, 
		"-h help\n"
		"-i use index file (no zip input)\n"
		"-z zip input\n"
		"-s skipheader\n"
		"-v version\n"
	);
}